

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_math_clz32(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue JVar1;
  int iVar2;
  undefined4 in_ECX;
  undefined8 in_R8;
  uint32_t r;
  uint32_t a;
  uint32_t *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_c;
  
  val.tag._0_4_ = in_stack_ffffffffffffffb0;
  val.u = (JSValueUnion)in_R8;
  val.tag._4_4_ = in_ECX;
  iVar2 = JS_ToUint32((JSContext *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98,val);
  if (iVar2 == 0) {
    if (in_stack_ffffffffffffffa4 == 0) {
      local_30 = 0x20;
    }
    else {
      local_30 = clz32(in_stack_ffffffffffffffa4);
    }
    uStack_2c = uStack_c;
    local_28 = 0;
  }
  else {
    local_30 = 0;
    local_28 = 6;
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_math_clz32(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    uint32_t a, r;

    if (JS_ToUint32(ctx, &a, argv[0]))
        return JS_EXCEPTION;
    if (a == 0)
        r = 32;
    else
        r = clz32(a);
    return JS_NewInt32(ctx, r);
}